

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcSpatialStructureElement::IfcSpatialStructureElement
          (IfcSpatialStructureElement *this)

{
  *(undefined ***)&this->field_0x158 = &PTR__Object_008278a0;
  *(undefined8 *)&this->field_0x160 = 0;
  *(char **)&this->field_0x168 = "IfcSpatialStructureElement";
  IfcProduct::IfcProduct(&this->super_IfcProduct,&PTR_construction_vtable_24__0086ccf0);
  *(undefined8 *)&(this->super_IfcProduct).field_0x108 = 0;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x86cc10;
  *(undefined8 *)&this->field_0x158 = 0x86ccd8;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0x86cc38;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x86cc60;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = 0x86cc88;
  *(undefined8 *)&(this->super_IfcProduct).field_0x100 = 0x86ccb0;
  *(undefined1 **)&(this->super_IfcProduct).field_0x110 = &this->field_0x120;
  *(undefined8 *)&this->field_0x118 = 0;
  this->field_0x120 = 0;
  this->field_0x130 = 0;
  (this->CompositionType)._M_dataplus._M_p = (pointer)&(this->CompositionType).field_2;
  (this->CompositionType)._M_string_length = 0;
  (this->CompositionType).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcSpatialStructureElement() : Object("IfcSpatialStructureElement") {}